

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_ssize
nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  nghttp2_session *session_00;
  nghttp2_frame *frame_00;
  nghttp2_session *item_00;
  long lVar5;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  nghttp2_buf *buf_1;
  size_t datalen_1;
  int pause;
  nghttp2_frame *frame_2;
  nghttp2_stream *stream;
  nghttp2_buf *buf;
  size_t datalen;
  int rv2_1;
  uint32_t error_code_1;
  int32_t opened_stream_id_1;
  nghttp2_frame *frame_1;
  nghttp2_frame *frame;
  int rv2;
  uint32_t error_code;
  int32_t opened_stream_id;
  nghttp2_outbound_item *item;
  nghttp2_mem *mem;
  nghttp2_bufs *framebufs;
  nghttp2_active_outbound_item *aob;
  int rv;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  nghttp2_session *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  nghttp2_outbound_item *in_stack_ffffffffffffff70;
  nghttp2_session *in_stack_ffffffffffffff78;
  nghttp2_session *in_stack_ffffffffffffff80;
  nghttp2_session *in_stack_ffffffffffffff88;
  int local_64;
  nghttp2_session *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_44;
  nghttp2_session *pnVar6;
  int local_20;
  
  session_00 = (nghttp2_session *)(in_RDI + 0xa08);
  iVar2 = nghttp2_session_adjust_idle_stream
                    ((nghttp2_session *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  iVar3 = nghttp2_is_fatal(iVar2);
  if (iVar3 != 0) {
    return (long)iVar2;
  }
  do {
    frame_00 = (nghttp2_frame *)(ulong)*(uint *)(in_RDI + 0x2d0);
    switch(frame_00) {
    case (nghttp2_frame *)0x0:
      item_00 = (nghttp2_session *)
                nghttp2_session_pop_next_ob_item
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (item_00 == (nghttp2_session *)0x0) {
        return 0;
      }
      local_20 = session_prep_frame(session_00,(nghttp2_outbound_item *)item_00);
      if (local_20 == -0x20e) {
        return 0;
      }
      if (local_20 != -0x1fc) {
        if (-1 < local_20) {
          *(nghttp2_session **)(in_RDI + 0x288) = item_00;
          *(undefined8 *)(in_RDI + 0x298) = *(undefined8 *)(in_RDI + 0x290);
          if ((((nghttp2_frame *)&item_00->streams)->hd).type == '\0') {
            if (*(char *)((long)&(item_00->root).seq + 2) != '\0') {
              *(undefined4 *)(in_RDI + 0x2d0) = 2;
              break;
            }
          }
          else {
            pnVar6 = item_00;
            iVar2 = session_call_before_frame_send(in_stack_ffffffffffffff58,frame_00);
            iVar3 = nghttp2_is_fatal(iVar2);
            if (iVar3 != 0) {
              return (long)iVar2;
            }
            if (iVar2 == -0x217) {
              local_64 = 0;
              if ((*(long *)(in_RDI + 0x970) != 0) &&
                 (iVar2 = (**(code **)(in_RDI + 0x970))
                                    (in_RDI,item_00,0xfffffde9,*(undefined8 *)(in_RDI + 0xa30)),
                 iVar2 != 0)) {
                return -0x386;
              }
              in_stack_ffffffffffffff48 = (uint)(((nghttp2_frame *)&pnVar6->streams)->hd).type;
              if (in_stack_ffffffffffffff48 == 1) {
                if ((int)(pnVar6->root).obq.length == 0) {
                  local_64 = (((nghttp2_frame *)&pnVar6->streams)->hd).stream_id;
                }
              }
              else if (in_stack_ffffffffffffff48 == 5) {
                local_64 = *(int *)&(pnVar6->root).obq.q;
              }
              if (local_64 != 0) {
                iVar2 = nghttp2_session_close_stream
                                  (in_stack_ffffffffffffff78,
                                   (int32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                   (uint32_t)in_stack_ffffffffffffff70);
                iVar3 = nghttp2_is_fatal(iVar2);
                if (iVar3 != 0) {
                  return (long)iVar2;
                }
              }
              active_outbound_item_reset
                        ((nghttp2_active_outbound_item *)&frame_00->hd,
                         (nghttp2_mem *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              break;
            }
          }
          *(undefined4 *)(in_RDI + 0x2d0) = 1;
          break;
        }
        local_44 = 0;
        local_4c = 0;
        pnVar6 = item_00;
        if (((((((nghttp2_frame *)&item_00->streams)->hd).type != '\0') &&
             (*(long *)(in_RDI + 0x970) != 0)) &&
            (iVar2 = is_non_fatal(local_20), pnVar6 = item_00, iVar2 != 0)) &&
           ((in_stack_ffffffffffffffa8 = item_00,
            (((nghttp2_frame *)&item_00->streams)->hd).type != '\b' &&
            (iVar2 = (**(code **)(in_RDI + 0x970))
                               (in_RDI,item_00,local_20,*(undefined8 *)(in_RDI + 0xa30)),
            in_stack_ffffffffffffffa8 = item_00, iVar2 != 0)))) {
          nghttp2_outbound_item_free
                    (in_stack_ffffffffffffff70,
                     (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          nghttp2_mem_free((nghttp2_mem *)&frame_00->hd,
                           (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          return -0x386;
        }
        in_stack_ffffffffffffff4c = (uint)(((nghttp2_frame *)&pnVar6->streams)->hd).type;
        if (in_stack_ffffffffffffff4c == 1) {
          if ((int)(pnVar6->root).obq.length == 0) {
            local_44 = (((nghttp2_frame *)&pnVar6->streams)->hd).stream_id;
          }
        }
        else if (in_stack_ffffffffffffff4c == 5) {
          local_44 = *(int *)&(pnVar6->root).obq.q;
        }
        if (local_44 != 0) {
          local_4c = nghttp2_session_close_stream
                               (in_stack_ffffffffffffff78,
                                (int32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                (uint32_t)in_stack_ffffffffffffff70);
        }
        nghttp2_outbound_item_free
                  (in_stack_ffffffffffffff70,
                   (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        nghttp2_mem_free((nghttp2_mem *)&frame_00->hd,
                         (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        active_outbound_item_reset
                  ((nghttp2_active_outbound_item *)&frame_00->hd,
                   (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        iVar2 = nghttp2_is_fatal(local_4c);
        if (iVar2 != 0) {
          return (long)local_4c;
        }
        if (local_20 == -0x20b) {
          local_20 = nghttp2_session_terminate_session
                               ((nghttp2_session *)&frame_00->hd,in_stack_ffffffffffffff4c);
        }
        iVar2 = nghttp2_is_fatal(local_20);
        if (iVar2 != 0) {
          return (long)local_20;
        }
      }
      break;
    case (nghttp2_frame *)0x1:
      lVar1 = *(long *)(in_RDI + 0x298);
      in_stack_ffffffffffffff80 = (nghttp2_session *)(lVar1 + 8);
      if (*(long *)(lVar1 + 0x18) != *(long *)(lVar1 + 0x20)) {
        *in_RSI = *(undefined8 *)(lVar1 + 0x18);
        lVar5 = *(long *)(lVar1 + 0x20) - *(long *)(lVar1 + 0x18);
        *(long *)(lVar1 + 0x18) = lVar5 + *(long *)(lVar1 + 0x18);
        return lVar5;
      }
      if (in_EDX == 0) {
        iVar2 = session_after_frame_sent1(in_stack_ffffffffffffffa8);
        if (iVar2 < 0) {
          iVar3 = nghttp2_is_fatal(iVar2);
          if (iVar3 != 0) {
            return (long)iVar2;
          }
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0xd69,
                        "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                       );
        }
        session_after_frame_sent2(in_stack_ffffffffffffff80);
      }
      else {
        session_after_frame_sent2(in_stack_ffffffffffffff80);
      }
      break;
    case (nghttp2_frame *)0x2:
      in_stack_ffffffffffffff70 = *(nghttp2_outbound_item **)(in_RDI + 0x288);
      in_stack_ffffffffffffff78 =
           (nghttp2_session *)nghttp2_session_get_stream(in_stack_ffffffffffffff58,0);
      if (in_stack_ffffffffffffff78 == (nghttp2_session *)0x0) {
        active_outbound_item_reset
                  ((nghttp2_active_outbound_item *)&frame_00->hd,
                   (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      else {
        iVar2 = session_call_send_data
                          (in_stack_ffffffffffffff88,
                           (nghttp2_outbound_item *)in_stack_ffffffffffffff80,
                           (nghttp2_bufs *)in_stack_ffffffffffffff78);
        iVar3 = nghttp2_is_fatal(iVar2);
        if (iVar3 != 0) {
          return (long)iVar2;
        }
        if (iVar2 == -0x209) {
          session_detach_stream_item
                    ((nghttp2_session *)&frame_00->hd,
                     (nghttp2_stream *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                    );
          iVar2 = nghttp2_session_add_rst_stream
                            (in_stack_ffffffffffffff88,
                             (int32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (uint32_t)in_stack_ffffffffffffff80);
          iVar3 = nghttp2_is_fatal(iVar2);
          if (iVar3 != 0) {
            return (long)iVar2;
          }
          active_outbound_item_reset
                    ((nghttp2_active_outbound_item *)&frame_00->hd,
                     (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        }
        else {
          if (iVar2 == -0x1f8) {
            return 0;
          }
          uVar4 = (uint)(iVar2 == -0x20e);
          iVar2 = session_after_frame_sent1(in_stack_ffffffffffffffa8);
          if (iVar2 < 0) {
            iVar3 = nghttp2_is_fatal(iVar2);
            if (iVar3 != 0) {
              return (long)iVar2;
            }
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0xda8,
                          "nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
          session_after_frame_sent2(in_stack_ffffffffffffff80);
          if (uVar4 != 0) {
            return 0;
          }
          in_stack_ffffffffffffff6c = 0;
        }
      }
      break;
    case (nghttp2_frame *)0x3:
      lVar1 = *(long *)(in_RDI + 0x298);
      in_stack_ffffffffffffff58 = (nghttp2_session *)(lVar1 + 8);
      if (*(long *)(lVar1 + 0x18) != *(long *)(lVar1 + 0x20)) {
        *in_RSI = *(undefined8 *)(lVar1 + 0x18);
        lVar5 = *(long *)(lVar1 + 0x20) - *(long *)(lVar1 + 0x18);
        *(long *)(lVar1 + 0x18) = lVar5 + *(long *)(lVar1 + 0x18);
        return lVar5;
      }
      active_outbound_item_reset
                ((nghttp2_active_outbound_item *)&frame_00->hd,
                 (nghttp2_mem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    default:
      break;
    }
  } while( true );
}

Assistant:

static nghttp2_ssize nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                       const uint8_t **data_ptr,
                                                       int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;
        int rv2 = 0;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                session, frame, rv, session->user_data) != 0) {
            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          rv2 =
            nghttp2_session_close_stream(session, opened_stream_id, error_code);
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (nghttp2_is_fatal(rv2)) {
          return rv2;
        }

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminate
             connection. */
          rv =
            nghttp2_session_terminate_session(session, NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%td\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          session_after_frame_sent2(session);
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        session_detach_stream_item(session, stream);

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      session_after_frame_sent2(session);

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (nghttp2_ssize)datalen;
    }
    }
  }
}